

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O2

void __thiscall chipemu::implementation::nmos::set_node(nmos *this,uint id,bool high)

{
  ushort uVar1;
  ushort uVar2;
  pointer puVar3;
  byte bVar4;
  ushort uVar5;
  
  if (id - 1 < (uint)this->desc_nodes_count) {
    puVar3 = (this->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = (this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_start[id];
    uVar2 = puVar3[uVar1];
    uVar5 = 2;
    bVar4 = (byte)uVar2;
    if (((bVar4 & !high) != 0) || (uVar5 = 1, ((~high | bVar4) & 1) == 0)) {
      puVar3[uVar1] = uVar5 | uVar2 & 0xfffc;
      changed_push(this,(uint16_t)id);
      return;
    }
  }
  return;
}

Assistant:

void
nmos::set_node(unsigned id, bool high) noexcept
{
    if (id > 0 and id <= node_count()) {
        uint16_t *node = node_addr(id);

        if ((*node & node_is_pullup) and not high) {
            *node &= ~node_is_pullup;
            *node |= node_is_pulldown;
        }
        else if (high and not (*node & node_is_pullup)) {
            *node |= node_is_pullup;
            *node &= ~node_is_pulldown;
        }
        else return;

        changed_push(id);
    }
}